

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

float GD::get_pred_per_update<true,false,false,0ul,1ul,2ul,false>(gd *g,example *ec)

{
  undefined4 uVar1;
  undefined4 uVar2;
  vw *all;
  double dVar3;
  float extraout_XMM0_Da;
  float fVar4;
  norm_data local_44;
  
  all = g->all;
  fVar4 = ec->weight;
  (*all->loss->_vptr_loss_function[5])((ec->pred).scalar);
  local_44.grad_squared = extraout_XMM0_Da * fVar4;
  if ((local_44.grad_squared != 0.0) || (NAN(local_44.grad_squared))) {
    local_44.pred_per_update = 0.0;
    local_44.norm_x = 0.0;
    uVar1 = g->neg_norm_power;
    uVar2 = g->neg_power_t;
    local_44.pd.neg_norm_power = (float)uVar1;
    local_44.pd.minus_power_t = (float)uVar2;
    local_44.extra_state[0] = 0.0;
    local_44.extra_state[1] = 0.0;
    local_44.extra_state[2] = 0.0;
    local_44.extra_state[3] = 0.0;
    foreach_feature<GD::norm_data,_float_&,_&GD::pred_per_update_feature>(all,ec,&local_44);
    g->all->normalized_sum_norm_x =
         (double)local_44.norm_x * (double)ec->weight + g->all->normalized_sum_norm_x;
    dVar3 = (double)ec->weight + g->total_weight;
    g->total_weight = dVar3;
    fVar4 = (float)dVar3 / (float)g->all->normalized_sum_norm_x;
    g->update_multiplier = fVar4;
    fVar4 = fVar4 * local_44.pred_per_update;
  }
  else {
    fVar4 = 1.0;
  }
  return fVar4;
}

Assistant:

float get_pred_per_update(gd& g, example& ec)
{
  // We must traverse the features in _precisely_ the same order as during training.
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float grad_squared = ec.weight;
  if (!adax)
    grad_squared *= all.loss->getSquareGrad(ec.pred.scalar, ld.label);

  if (grad_squared == 0 && !stateless)
    return 1.;

  norm_data nd = {grad_squared, 0., 0., {g.neg_power_t, g.neg_norm_power}, {0}};
  foreach_feature<norm_data,
      pred_per_update_feature<sqrt_rate, feature_mask_off, adaptive, normalized, spare, stateless> >(all, ec, nd);
  if (normalized)
  {
    if (!stateless)
    {
      g.all->normalized_sum_norm_x += ((double)ec.weight) * nd.norm_x;
      g.total_weight += ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(
          (float)g.total_weight, (float)g.all->normalized_sum_norm_x, g.neg_norm_power);
    }
    else
    {
      float nsnx = ((float)g.all->normalized_sum_norm_x) + ec.weight * nd.norm_x;
      float tw = (float)g.total_weight + ec.weight;
      g.update_multiplier = average_update<sqrt_rate, adaptive, normalized>(tw, nsnx, g.neg_norm_power);
    }
    nd.pred_per_update *= g.update_multiplier;
  }
  return nd.pred_per_update;
}